

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O0

void h265_free(h265_stream_t *h)

{
  h265_sei_t *sei;
  int i_3;
  int i_2;
  int i_1;
  int i;
  h265_stream_t *h_local;
  
  free(h->nal);
  for (i_2 = 0; i_2 < 0x10; i_2 = i_2 + 1) {
    if (h->vps_table[i_2] != (h265_vps_t *)0x0) {
      free(h->vps_table[i_2]);
    }
  }
  for (i_3 = 0; i_3 < 0x20; i_3 = i_3 + 1) {
    if (h->sps_table[i_3] != (h265_sps_t *)0x0) {
      free(h->sps_table[i_3]);
    }
  }
  for (sei._4_4_ = 0; sei._4_4_ < 0x100; sei._4_4_ = sei._4_4_ + 1) {
    if (h->pps_table[sei._4_4_] != (h265_pps_t *)0x0) {
      free(h->pps_table[sei._4_4_]);
    }
  }
  if (h->aud != (h265_aud_t *)0x0) {
    free(h->aud);
  }
  if (h->seis != (h265_sei_t **)0x0) {
    for (sei._0_4_ = 0; (int)sei < h->num_seis; sei._0_4_ = (int)sei + 1) {
      h265_sei_free(h->seis[(int)sei]);
    }
    free(h->seis);
  }
  free(h->sh);
  free(h);
  return;
}

Assistant:

void h265_free(h265_stream_t* h)
{
    free(h->nal);
    for ( int i = 0; i < 16; i++ ) { if (h->vps_table[i]!=NULL) free( h->vps_table[i] ); }
    for ( int i = 0; i < 32; i++ ) { if (h->sps_table[i]!=NULL) free( h->sps_table[i] ); }
    for ( int i = 0; i < 256; i++ ) { if (h->pps_table[i]!=NULL) free( h->pps_table[i] ); }

    if (h->aud != NULL)
    {
        free(h->aud);
    }

    if(h->seis != NULL)
    {
        for( int i = 0; i < h->num_seis; i++ )
        {
            h265_sei_t* sei = h->seis[i];
            h265_sei_free(sei);
        }
        free(h->seis);
    }
    free(h->sh);
    free(h);
}